

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-utils.h
# Opt level: O2

void dg::llvmutils::printerr(char *msg,Value *val,bool newline)

{
  raw_ostream *os;
  
  os = (raw_ostream *)llvm::errs();
  print(val,os,msg,newline);
  return;
}

Assistant:

inline void printerr(const char *msg, const Value *val, bool newline = true) {
    print(val, errs(), msg, newline);
}